

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.c
# Opt level: O2

void qcc_engine_run_test(qcc_engine *eng,char *name,qcc_test_fn test_fn)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  qcc_stream_data data;
  qcc_test_result qVar5;
  long lVar6;
  qcc_stream *pqVar7;
  qcc_arena *arena;
  qcc_stream *pqVar8;
  uint uVar9;
  qcc_stream_interval *pqVar10;
  uint uVar11;
  size_t num;
  byte bVar12;
  undefined1 auVar13 [16];
  qcc_stream_data shrinked_data;
  qcc_logger logger;
  qcc_logger local_d8;
  qcc_stream stream;
  qcc_stream tmp_stream;
  
  bVar12 = 0;
  uVar9 = 0;
  uVar11 = 0xffffffff;
  do {
    uVar11 = uVar11 + 1;
    if (uVar11 == eng->max_tries) break;
    qcc_arena_reset(eng->active_arena);
    qcc_stream_init(&stream,(qcc_stream_data *)0x0,eng->active_arena);
    qcc_logger_init(&logger,eng->active_arena);
    qVar5 = _run_test_once(eng,name,test_fn,&stream,&logger);
    if (qVar5 == QCC_TEST_FAIL) {
      uVar1 = eng->total_tests;
      uVar3 = eng->failed_tests;
      eng->total_tests = uVar1 + 1;
      eng->failed_tests = uVar3 + 1;
      arena = eng->backup_arena;
      eng->backup_arena = eng->active_arena;
      eng->active_arena = arena;
      goto LAB_00102add;
    }
    uVar9 = uVar9 + (qVar5 == QCC_TEST_SUCCEED);
  } while (uVar9 != eng->required_successes);
  if (uVar9 == 0) {
    uVar2 = eng->total_tests;
    uVar4 = eng->failed_tests;
    eng->total_tests = uVar2 + 1;
    eng->failed_tests = uVar4 + 1;
    qcc_logger_printf(&eng->logger,"%s: ABORTED\n",name);
    qcc_logger_printf(&eng->logger,"    No input was accepted by test as valid\n");
  }
  else {
    eng->total_tests = eng->total_tests + 1;
    if (uVar9 < eng->required_successes) {
      qcc_logger_printf(&eng->logger,"%s:\n",name);
      qcc_logger_printf(&eng->logger,"    Warning: Only %u successful runs out of %u were made\n",
                        (ulong)uVar9,(ulong)eng->required_successes);
    }
  }
  return;
LAB_00102add:
  qcc_arena_reset(arena);
  lVar6 = 0;
LAB_00102ae5:
  pqVar10 = stream.interval_data.first;
  if (lVar6 == 4) {
    qcc_logger_append(&eng->logger,"%s",&logger);
    return;
  }
LAB_00102af4:
  if (pqVar10 == (qcc_stream_interval *)0x0) goto LAB_00102b86;
  data.first._1_1_ = stream.data.first._1_1_;
  data.first._0_1_ = (char)stream.data.first;
  data.first._2_1_ = stream.data.first._2_1_;
  data.first._3_1_ = stream.data.first._3_1_;
  data.first._4_1_ = stream.data.first._4_1_;
  data.first._5_1_ = stream.data.first._5_1_;
  data.first._6_1_ = stream.data.first._6_1_;
  data.first._7_1_ = stream.data.first._7_1_;
  data.last._0_1_ = (char)stream.data.last;
  data.last._1_1_ = stream.data.last._1_1_;
  data.last._2_1_ = stream.data.last._2_1_;
  data.last._3_1_ = stream.data.last._3_1_;
  data.last._4_1_ = stream.data.last._4_1_;
  data.last._5_1_ = stream.data.last._5_1_;
  data.last._6_1_ = stream.data.last._6_1_;
  data.last._7_1_ = stream.data.last._7_1_;
  shrinked_data =
       qcc_stream_data_process
                 (data,eng->active_arena,pqVar10->begin,pqVar10->end,
                  (qcc_stream_data_process_fn)(&_run_test_and_shrink_try_shrink)[lVar6]);
  auVar13[0] = -((char)shrinked_data.first == (char)stream.data.first);
  auVar13[1] = -(shrinked_data.first._1_1_ == stream.data.first._1_1_);
  auVar13[2] = -(shrinked_data.first._2_1_ == stream.data.first._2_1_);
  auVar13[3] = -(shrinked_data.first._3_1_ == stream.data.first._3_1_);
  auVar13[4] = -(shrinked_data.first._4_1_ == stream.data.first._4_1_);
  auVar13[5] = -(shrinked_data.first._5_1_ == stream.data.first._5_1_);
  auVar13[6] = -(shrinked_data.first._6_1_ == stream.data.first._6_1_);
  auVar13[7] = -(shrinked_data.first._7_1_ == stream.data.first._7_1_);
  auVar13[8] = -((char)shrinked_data.last == (char)stream.data.last);
  auVar13[9] = -(shrinked_data.last._1_1_ == stream.data.last._1_1_);
  auVar13[10] = -(shrinked_data.last._2_1_ == stream.data.last._2_1_);
  auVar13[0xb] = -(shrinked_data.last._3_1_ == stream.data.last._3_1_);
  auVar13[0xc] = -(shrinked_data.last._4_1_ == stream.data.last._4_1_);
  auVar13[0xd] = -(shrinked_data.last._5_1_ == stream.data.last._5_1_);
  auVar13[0xe] = -(shrinked_data.last._6_1_ == stream.data.last._6_1_);
  auVar13[0xf] = -(shrinked_data.last._7_1_ == stream.data.last._7_1_);
  if ((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe | (ushort)(auVar13[0xf] >> 7) << 0xf)
      != 0xffff) {
    qcc_stream_init(&tmp_stream,&shrinked_data,eng->active_arena);
    qcc_logger_init(&local_d8,eng->active_arena);
    qVar5 = _run_test_once(eng,name,test_fn,&tmp_stream,&local_d8);
    if (qVar5 == QCC_TEST_FAIL) goto LAB_00102b8e;
  }
  pqVar10 = pqVar10->next;
  goto LAB_00102af4;
LAB_00102b86:
  lVar6 = lVar6 + 1;
  goto LAB_00102ae5;
LAB_00102b8e:
  pqVar7 = &tmp_stream;
  pqVar8 = &stream;
  for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
    pqVar8->arena = pqVar7->arena;
    pqVar7 = (qcc_stream *)((long)pqVar7 + (ulong)bVar12 * -0x10 + 8);
    pqVar8 = (qcc_stream *)((long)pqVar8 + (ulong)bVar12 * -0x10 + 8);
  }
  arena = eng->backup_arena;
  eng->backup_arena = eng->active_arena;
  eng->active_arena = arena;
  goto LAB_00102add;
}

Assistant:

void qcc_engine_run_test(struct qcc_engine *eng, const char *name,
                         qcc_test_fn test_fn)
{
    unsigned successes = 0;
    for (unsigned i = 0; i != eng->max_tries; ++i)
    {
        switch (_run_test_and_shrink(eng, name, test_fn))
        {
        case QCC_TEST_SUCCEED:
            ++successes;
            break;
        case QCC_TEST_FAIL:
            return;
        case QCC_TEST_SKIP:
        case QCC_TEST_OVERRUN:
            break;
        }

        if (successes == eng->required_successes) break;
    }

    if (successes == 0)
    {
        qcc_engine_failure(eng);
        qcc_logger_printf(&eng->logger, "%s: ABORTED\n", name);
        qcc_logger_printf(&eng->logger,
                          "    No input was accepted by test as valid\n");
        return;
    }

    ++eng->total_tests;
    if (successes < eng->required_successes)
    {
        qcc_logger_printf(&eng->logger, "%s:\n", name);
        qcc_logger_printf(
            &eng->logger,
            "    Warning: Only %u successful runs out of %u were made\n",
            successes, eng->required_successes);
    }
}